

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

vw * VW::seed_vw_model(vw *vw_model,string *extra_args,trace_message_t trace_listener,
                      void *trace_context)

{
  bool bVar1;
  int iVar2;
  vw *pvVar3;
  shared_ptr<VW::config::base_option> *option;
  _Alloc_hider _Var4;
  string serialized_options;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  options_serializer_boost_po serializer;
  
  config::options_serializer_boost_po::options_serializer_boost_po(&serializer);
  (*vw_model->options->_vptr_options_i[3])(&serialized_options);
  for (_Var4 = serialized_options._M_dataplus;
      _Var4._M_p != (pointer)serialized_options._M_string_length; _Var4._M_p = _Var4._M_p + 0x10) {
    iVar2 = (*vw_model->options->_vptr_options_i[1])(vw_model->options,*(long *)_Var4._M_p + 8);
    if ((char)iVar2 != '\0') {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)_Var4._M_p + 8),"no_stdin");
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(*(long *)_Var4._M_p + 8),"initial_regressor");
        if (!bVar1) {
          config::options_serializer_boost_po::add(&serializer,*(base_option **)_Var4._M_p);
        }
      }
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
             *)&serialized_options);
  config::options_serializer_boost_po::str_abi_cxx11_(&serialized_options,&serializer);
  std::operator+(&local_200,&serialized_options," ");
  std::operator+(&local_1e0,&local_200,extra_args);
  std::__cxx11::string::operator=((string *)&serialized_options,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string
            ((string *)&local_220,serialized_options._M_dataplus._M_p,(allocator *)&local_1e0);
  pvVar3 = initialize(&local_220,(io_buf *)0x0,true,trace_listener,trace_context);
  std::__cxx11::string::~string((string *)&local_220);
  free(pvVar3->sd);
  parameters::shallow_copy(&pvVar3->weights,&vw_model->weights);
  pvVar3->sd = vw_model->sd;
  std::__cxx11::string::~string((string *)&serialized_options);
  config::options_serializer_boost_po::~options_serializer_boost_po(&serializer);
  return pvVar3;
}

Assistant:

vw* seed_vw_model(vw* vw_model, const string extra_args, trace_message_t trace_listener, void* trace_context)
{
  options_serializer_boost_po serializer;
  for (auto const& option : vw_model->options->get_all_options())
  {
    if (vw_model->options->was_supplied(option->m_name))
    {
      // ignore no_stdin since it will be added by vw::initialize, and ignore -i since we don't want to reload the
      // model.
      if (option->m_name == "no_stdin" || option->m_name == "initial_regressor")
      {
        continue;
      }

      serializer.add(*option);
    }
  }

  auto serialized_options = serializer.str();
  serialized_options = serialized_options + " " + extra_args;

  vw* new_model =
      VW::initialize(serialized_options.c_str(), nullptr, true /* skipModelLoad */, trace_listener, trace_context);
  free_it(new_model->sd);

  // reference model states stored in the specified VW instance
  new_model->weights.shallow_copy(vw_model->weights);  // regressor
  new_model->sd = vw_model->sd;                        // shared data

  return new_model;
}